

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int mbedtls_ecdsa_verify
              (mbedtls_ecp_group *grp,uchar *buf,size_t blen,mbedtls_ecp_point *Q,mbedtls_mpi *r,
              mbedtls_mpi *s)

{
  int iVar1;
  mbedtls_mpi *s_local;
  mbedtls_mpi *r_local;
  mbedtls_ecp_point *Q_local;
  size_t blen_local;
  uchar *buf_local;
  mbedtls_ecp_group *grp_local;
  
  iVar1 = ecdsa_verify_restartable(grp,buf,blen,Q,r,s,(mbedtls_ecdsa_restart_ctx *)0x0);
  return iVar1;
}

Assistant:

int mbedtls_ecdsa_verify( mbedtls_ecp_group *grp,
                          const unsigned char *buf, size_t blen,
                          const mbedtls_ecp_point *Q,
                          const mbedtls_mpi *r,
                          const mbedtls_mpi *s)
{
    ECDSA_VALIDATE_RET( grp != NULL );
    ECDSA_VALIDATE_RET( Q   != NULL );
    ECDSA_VALIDATE_RET( r   != NULL );
    ECDSA_VALIDATE_RET( s   != NULL );
    ECDSA_VALIDATE_RET( buf != NULL || blen == 0 );

    return( ecdsa_verify_restartable( grp, buf, blen, Q, r, s, NULL ) );
}